

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::
ContextScope<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JustWhit3[P]arsenalgear-cpp/test/unit_tests/tests_utils.cpp:53:3)>
::stringify(ContextScope<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JustWhit3[P]arsenalgear_cpp_test_unit_tests_tests_utils_cpp:53:3)>
            *this,ostream *s)

{
  MessageBuilder local_50;
  
  MessageBuilder::MessageBuilder
            (&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/JustWhit3[P]arsenalgear-cpp/test/unit_tests/tests_utils.cpp"
             ,0x35,is_warn);
  local_50.m_stream = s;
  MessageBuilder::operator_(&local_50,(this->lambda_).test_string);
  MessageBuilder::~MessageBuilder(&local_50);
  return;
}

Assistant:

void stringify(std::ostream* s) const override { lambda_(s); }